

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * units::definedUnitsFromFile(string *__return_storage_ptr__,string *filename)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  istream *piVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  uint64_t match_flags;
  precise_unit pVar10;
  exception *e;
  undefined8 local_460;
  precise_unit local_458;
  precise_unit local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  string local_3f8;
  undefined1 local_3d8 [8];
  precise_measurement meas;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b8;
  undefined8 local_3b0;
  string local_3a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> meas_string;
  size_type sloc;
  undefined8 local_340;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_338;
  undefined8 local_330;
  undefined1 local_328 [8];
  string userdef;
  undefined1 local_300 [4];
  int length;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  long local_2c0;
  size_type sep;
  long lStack_2b0;
  bool notfound;
  size_t esep;
  size_type commentloc;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  istream local_228 [8];
  ifstream infile;
  string *filename_local;
  string *output;
  
  bVar2 = false;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::ifstream::ifstream(local_228,filename,8);
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) == 0) {
    std::operator+(&local_278,"unable to read file ",filename);
    std::operator+(&local_258,&local_278,"\n");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_278);
    bVar2 = true;
    line.field_2._12_4_ = 1;
  }
  else {
    std::__cxx11::string::string((string *)&commentloc);
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_228,(string *)&commentloc);
      bVar4 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar4) break;
      esep = std::__cxx11::string::find_first_not_of((char *)&commentloc,0x1d078d);
      if (esep != 0xffffffffffffffff) {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&commentloc);
        if (*pcVar6 != '#') {
          lStack_2b0 = 1;
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&commentloc);
          if (*pcVar6 == '\"') {
LAB_0018de25:
            sep._7_1_ = 1;
            while ((sep._7_1_ & 1) != 0) {
              pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&commentloc);
              lStack_2b0 = std::__cxx11::string::find_first_of
                                     ((char)&commentloc,(ulong)(uint)(int)*pcVar6);
              if (lStack_2b0 == -1) {
                lStack_2b0 = 1;
                break;
              }
              pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&commentloc);
              if (*pcVar6 == '\\') {
                std::__cxx11::string::erase((ulong)&commentloc,lStack_2b0 - 1);
              }
              else {
                sep._7_1_ = 0;
              }
              lStack_2b0 = lStack_2b0 - esep;
            }
          }
          else {
            pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&commentloc);
            if (*pcVar6 == '\'') goto LAB_0018de25;
          }
          lVar7 = std::__cxx11::string::find_first_of((char *)&commentloc,0x1d0791);
          local_2c0 = lVar7;
          if (lVar7 == -1) {
            std::operator+(&local_2e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &commentloc," is not a valid user defined unit definition\n");
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2e0);
            std::__cxx11::string::~string((string *)&local_2e0);
          }
          else {
            lVar8 = std::__cxx11::string::size();
            if (lVar7 == lVar8 + -1) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_300,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &commentloc," does not have any valid definitions\n");
              std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_300)
              ;
              std::__cxx11::string::~string((string *)local_300);
            }
            userdef.field_2._12_4_ = 0;
            pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&commentloc);
            if (*pcVar6 == '=') {
LAB_0018e09a:
              userdef.field_2._12_4_ = 1;
            }
            else {
              pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&commentloc);
              if (*pcVar6 == '>') goto LAB_0018e09a;
            }
            if (userdef.field_2._12_4_ == 0) {
              pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&commentloc);
              if (*pcVar6 == '<') {
                userdef.field_2._12_4_ = 1;
                local_2c0 = local_2c0 + -1;
              }
            }
            std::__cxx11::string::substr((ulong)local_328,(ulong)&commentloc);
            while( true ) {
              pcVar6 = (char *)std::__cxx11::string::back();
              if (*pcVar6 != ' ') break;
              std::__cxx11::string::pop_back();
            }
            pcVar6 = (char *)std::__cxx11::string::front();
            if (*pcVar6 == '\"') {
LAB_0018e16d:
              pcVar6 = (char *)std::__cxx11::string::back();
              cVar1 = *pcVar6;
              pcVar6 = (char *)std::__cxx11::string::front();
              if (cVar1 == *pcVar6) {
                std::__cxx11::string::pop_back();
                local_338._M_current = (char *)std::__cxx11::string::begin();
                __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                __normal_iterator<char*>
                          ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_330,
                           &local_338);
                local_340 = std::__cxx11::string::erase(local_328,local_330);
              }
            }
            else {
              pcVar6 = (char *)std::__cxx11::string::front();
              if (*pcVar6 == '\'') goto LAB_0018e16d;
            }
            uVar9 = std::__cxx11::string::empty();
            if ((uVar9 & 1) == 0) {
              lVar7 = std::__cxx11::string::find_first_not_of((char *)&commentloc,0x1d080a);
              if (lVar7 == -1) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&meas_string.field_2 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &commentloc," does not specify a unit definition string\n");
                std::__cxx11::string::operator+=
                          ((string *)__return_storage_ptr__,
                           (string *)(meas_string.field_2._M_local_buf + 8));
                std::__cxx11::string::~string((string *)(meas_string.field_2._M_local_buf + 8));
                line.field_2._12_4_ = 2;
              }
              else {
                std::__cxx11::string::substr((ulong)local_3a8,(ulong)&commentloc);
                while( true ) {
                  pcVar6 = (char *)std::__cxx11::string::back();
                  if (*pcVar6 != ' ') break;
                  std::__cxx11::string::pop_back();
                }
                pcVar6 = (char *)std::__cxx11::string::front();
                if (*pcVar6 == '\"') {
LAB_0018e3b6:
                  pcVar6 = (char *)std::__cxx11::string::back();
                  cVar1 = *pcVar6;
                  pcVar6 = (char *)std::__cxx11::string::front();
                  if (cVar1 == *pcVar6) {
                    std::__cxx11::string::pop_back();
                    local_3b8._M_current = (char *)std::__cxx11::string::begin();
                    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                    __normal_iterator<char*>
                              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_3b0,
                               &local_3b8);
                    meas.units_._8_8_ = std::__cxx11::string::erase(local_3a8,local_3b0);
                  }
                }
                else {
                  pcVar6 = (char *)std::__cxx11::string::front();
                  if (*pcVar6 == '\'') goto LAB_0018e3b6;
                }
                std::__cxx11::string::string((string *)&local_3f8,local_3a8);
                match_flags = getDefaultFlags();
                measurement_from_string((precise_measurement *)local_3d8,&local_3f8,match_flags);
                std::__cxx11::string::~string((string *)&local_3f8);
                bVar4 = is_valid((precise_measurement *)local_3d8);
                if (bVar4) {
                  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&commentloc);
                  if (*pcVar6 == '>') {
                    pVar10 = precise_measurement::as_unit((precise_measurement *)local_3d8);
                    local_448 = pVar10;
                    addUserDefinedInputUnit((string *)local_328,&local_448);
                  }
                  else {
                    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&commentloc);
                    if (*pcVar6 == '<') {
                      pVar10 = precise_measurement::as_unit((precise_measurement *)local_3d8);
                      local_458 = pVar10;
                      addUserDefinedOutputUnit((string *)local_328,&local_458);
                    }
                    else {
                      pVar10 = precise_measurement::as_unit((precise_measurement *)local_3d8);
                      local_460 = pVar10._8_8_;
                      e = (exception *)pVar10.multiplier_;
                      addUserDefinedUnit((string *)local_328,(precise_unit *)&e);
                    }
                  }
                  line.field_2._12_4_ = 0;
                }
                else {
                  std::__cxx11::string::substr((ulong)&local_438,(ulong)&commentloc);
                  std::operator+(&local_418,&local_438," does not generate a valid unit\n");
                  std::__cxx11::string::operator+=
                            ((string *)__return_storage_ptr__,(string *)&local_418);
                  std::__cxx11::string::~string((string *)&local_418);
                  std::__cxx11::string::~string((string *)&local_438);
                  line.field_2._12_4_ = 2;
                }
                std::__cxx11::string::~string(local_3a8);
              }
            }
            else {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &sloc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&commentloc," does not specify a user string\n");
              std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&sloc);
              std::__cxx11::string::~string((string *)&sloc);
              line.field_2._12_4_ = 2;
            }
            std::__cxx11::string::~string((string *)local_328);
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&commentloc);
    line.field_2._12_4_ = 0;
  }
  std::ifstream::~ifstream(local_228);
  if (line.field_2._12_4_ == 0) {
    bVar2 = true;
    line.field_2._12_4_ = 1;
  }
  if (!bVar2) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string definedUnitsFromFile(const std::string& filename) noexcept
{
    std::string output;
    try {
        std::ifstream infile(filename);
        if (!infile.is_open()) {
            output = "unable to read file " + filename + "\n";
            return output;
        }
        std::string line;
        while (std::getline(infile, line)) {
            auto commentloc = line.find_first_not_of(" \t\n");
            if (commentloc == std::string::npos || line[commentloc] == '#') {
                continue;
            }
            std::size_t esep{1};  // extra separation location to handle quotes
            if (line[commentloc] == '\"' || line[commentloc] == '\'') {
                bool notfound{true};
                while (notfound) {
                    esep =
                        line.find_first_of(line[commentloc], commentloc + esep);
                    if (esep == std::string::npos) {
                        esep = 1;
                        break;
                    }
                    if (line[esep - 1] != '\\') {
                        notfound = false;
                    } else {
                        // remove the escaped quote
                        line.erase(esep - 1, 1);
                    }
                    esep -= commentloc;
                }
            }
            auto sep = line.find_first_of(",;=", commentloc + esep);
            if (sep == std::string::npos) {
                output +=
                    line + " is not a valid user defined unit definition\n";
                continue;
            }
            if (sep == line.size() - 1) {
                output += line + " does not have any valid definitions\n";
            }
            int length{0};
            if (line[sep + 1] == '=' || line[sep + 1] == '>') {
                length = 1;
            }
            if (length == 0 && line[sep - 1] == '<') {
                length = 1;
                --sep;
            }
            // get the new definition name
            std::string userdef = line.substr(commentloc, sep - commentloc);
            while (userdef.back() == ' ') {
                userdef.pop_back();
            }
            // remove quotes
            if ((userdef.front() == '\"' || userdef.front() == '\'') &&
                userdef.back() == userdef.front()) {
                userdef.pop_back();
                userdef.erase(userdef.begin());
            }
            if (userdef.empty()) {
                output += line + " does not specify a user string\n";
                continue;
            }
            // the unit string
            auto sloc = line.find_first_not_of(" \t", sep + length + 1);
            if (sloc == std::string::npos) {
                output += line + " does not specify a unit definition string\n";
                continue;
            }
            auto meas_string = line.substr(sloc);
            while (meas_string.back() == ' ') {
                meas_string.pop_back();
            }
            if ((meas_string.front() == '\"' || meas_string.front() == '\'') &&
                meas_string.back() == meas_string.front()) {
                meas_string.pop_back();
                meas_string.erase(meas_string.begin());
            }
            auto meas = measurement_from_string(meas_string);
            if (!is_valid(meas)) {
                output +=
                    line.substr(sloc) + " does not generate a valid unit\n";
                continue;
            }

            if (line[sep + length] == '>') {
                addUserDefinedInputUnit(userdef, meas.as_unit());
            } else if (line[sep] == '<') {
                addUserDefinedOutputUnit(userdef, meas.as_unit());
            } else {
                addUserDefinedUnit(userdef, meas.as_unit());
            }
        }
    }
    // LCOV_EXCL_START
    catch (const std::exception& e) {
        output += e.what();
        output.push_back('\n');
        // this is mainly just to catch any weird errors coming from somewhere
        // so this function can be noexcept
    }
    // LCOV_EXCL_STOP
    return output;
}